

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

bool __thiscall
google::protobuf::Reflection::IsSingularFieldNonEmpty
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  CppStringType CVar2;
  float *pfVar3;
  bool *pbVar4;
  double *pdVar5;
  Cord *this_00;
  InlinedStringField *pIVar6;
  ArenaStringPtr *pAVar7;
  char *failure_msg;
  int line;
  LogMessageFatal LStack_28;
  
  if (((field->containing_type_ == (Descriptor *)0x0) ||
      ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false)) &&
     (bVar1 = FieldDescriptor::has_presence(field), bVar1)) {
    failure_msg = "IsMapEntry(field) || !field->has_presence()";
    line = 0xbf0;
LAB_001c58cc:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&LStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    failure_msg = "!field->is_repeated()";
    line = 0xbf1;
    goto LAB_001c58cc;
  }
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    failure_msg = "!field->is_map()";
    line = 0xbf2;
    goto LAB_001c58cc;
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
  case 8:
    pfVar3 = (float *)GetRaw<int>(this,message,field);
    break;
  case 2:
    pdVar5 = (double *)GetRaw<long>(this,message,field);
    goto LAB_001c57c2;
  case 3:
    pfVar3 = (float *)GetRaw<unsigned_int>(this,message,field);
    break;
  case 4:
    pdVar5 = (double *)GetRaw<unsigned_long>(this,message,field);
    goto LAB_001c57c2;
  case 5:
    pdVar5 = GetRaw<double>(this,message,field);
LAB_001c57c2:
    bVar1 = *pdVar5 == 0.0;
    goto LAB_001c57d9;
  case 6:
    pfVar3 = GetRaw<float>(this,message,field);
    break;
  case 7:
    pbVar4 = GetRaw<bool>(this,message,field);
    return *pbVar4;
  case 9:
    CVar2 = FieldDescriptor::cpp_string_type(field);
    if ((CVar2 != kView) && (CVar2 != kString)) {
      if (CVar2 == kCord) {
        this_00 = GetRaw<absl::lts_20250127::Cord_const>(this,message,field);
        bVar1 = absl::lts_20250127::Cord::empty(this_00);
        return !bVar1;
      }
      internal::Unreachable
                ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0xc20);
    }
    bVar1 = internal::ReflectionSchema::IsFieldInlined(&this->schema_,field);
    if (bVar1) {
      pIVar6 = GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
    }
    else {
      pAVar7 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
      pIVar6 = (InlinedStringField *)((ulong)(pAVar7->tagged_ptr_).ptr_ & 0xfffffffffffffffc);
    }
    bVar1 = (pIVar6->field_0).str_._M_string_length == 0;
    goto LAB_001c57d9;
  case 10:
    failure_msg = "field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE";
    line = 0xbf3;
    goto LAB_001c58cc;
  default:
    internal::Unreachable
              ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xc24);
  }
  bVar1 = *pfVar3 == 0.0;
LAB_001c57d9:
  return !bVar1;
}

Assistant:

bool Reflection::IsSingularFieldNonEmpty(const Message& message,
                                         const FieldDescriptor* field) const {
  ABSL_DCHECK(IsMapEntry(field) || !field->has_presence());
  ABSL_DCHECK(!field->is_repeated());
  ABSL_DCHECK(!field->is_map());
  ABSL_DCHECK(field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE);
  // Scalar primitive (numeric or string/bytes) fields are present if
  // their value is non-zero (numeric) or non-empty (string/bytes). N.B.:
  // we must use this definition here, rather than the "scalar fields
  // always present" in the proto3 docs, because MergeFrom() semantics
  // require presence as "present on wire", and reflection-based merge
  // (which uses HasField()) needs to be consistent with this.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return GetRaw<bool>(message, field) != false;
    case FieldDescriptor::CPPTYPE_INT32:
      return GetRaw<int32_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_INT64:
      return GetRaw<int64_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_UINT32:
      return GetRaw<uint32_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_UINT64:
      return GetRaw<uint64_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_FLOAT:
      static_assert(sizeof(uint32_t) == sizeof(float),
                    "Code assumes uint32_t and float are the same size.");
      return absl::bit_cast<uint32_t>(GetRaw<float>(message, field)) != 0;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      static_assert(sizeof(uint64_t) == sizeof(double),
                    "Code assumes uint64_t and double are the same size.");
      return absl::bit_cast<uint64_t>(GetRaw<double>(message, field)) != 0;
    case FieldDescriptor::CPPTYPE_ENUM:
      return GetRaw<int>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_STRING:
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kCord:
          return !GetField<const absl::Cord>(message, field).empty();
        case FieldDescriptor::CppStringType::kView:
        case FieldDescriptor::CppStringType::kString: {
          if (IsInlined(field)) {
            return !GetField<InlinedStringField>(message, field)
                        .GetNoArena()
                        .empty();
          } else if (IsMicroString(field)) {
            return !GetField<MicroString>(message, field).Get().empty();
          }

          return !GetField<ArenaStringPtr>(message, field).Get().empty();
        }
        default:
          internal::Unreachable();
      }
    case FieldDescriptor::CPPTYPE_MESSAGE:
    default:
      internal::Unreachable();
  }
}